

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH64_hash_t XXH3_hashLong_internal(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize)

{
  XXH64_hash_t XVar1;
  xxh_u8 *in_RCX;
  xxh_u64 *in_RDX;
  xxh_u64 acc [8];
  undefined1 auStackY_a0 [8];
  xxh_u64 in_stack_ffffffffffffff68;
  xxh_u8 *in_stack_ffffffffffffff70;
  xxh_u64 *in_stack_ffffffffffffff78;
  XXH3_accWidth_e in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  xxh_u8 *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  
  memcpy(auStackY_a0,&DAT_002bc2c0,0x40);
  XXH3_hashLong_internal_loop
            (in_RDX,in_RCX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  XVar1 = XXH3_mergeAccs(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68);
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t
XXH3_hashLong_internal(const xxh_u8* XXH_RESTRICT input, size_t len,
                       const xxh_u8* XXH_RESTRICT secret, size_t secretSize)
{
    XXH_ALIGN(XXH_ACC_ALIGN) xxh_u64 acc[ACC_NB] = XXH3_INIT_ACC;

    XXH3_hashLong_internal_loop(acc, input, len, secret, secretSize, XXH3_acc_64bits);

    /* converge into final hash */
    XXH_STATIC_ASSERT(sizeof(acc) == 64);
    /* do not align on 8, so that the secret is different from the accumulator */
#define XXH_SECRET_MERGEACCS_START 11
    XXH_ASSERT(secretSize >= sizeof(acc) + XXH_SECRET_MERGEACCS_START);
    return XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START, (xxh_u64)len * PRIME64_1);
}